

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O3

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnStartFunction
          (BinaryReaderInterp *this,Index func_index)

{
  ModuleDesc *pMVar1;
  iterator __position;
  Result RVar2;
  Enum EVar3;
  Location loc;
  Location loc_1;
  Location local_b8;
  Location local_98;
  Var local_78;
  
  local_b8.field_1.field_0.last_column = 0;
  local_b8.filename._M_len = (this->filename_)._M_len;
  local_b8.filename._M_str = (this->filename_)._M_str;
  local_b8.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  local_98.field_1.field_0.last_column = 0;
  local_98.filename._M_len = (this->filename_)._M_len;
  local_98.filename._M_str = (this->filename_)._M_str;
  local_98.field_1.field_1.offset = local_b8.field_1.field_1.offset;
  Var::Var(&local_78,func_index,&local_98);
  RVar2 = SharedValidator::OnStart(&this->validator_,&local_b8,&local_78);
  Var::~Var(&local_78);
  EVar3 = Error;
  if (RVar2.enum_ != Error) {
    pMVar1 = this->module_;
    local_b8.filename._M_len = CONCAT44(local_b8.filename._M_len._4_4_,func_index);
    __position._M_current =
         (pMVar1->starts).
         super__Vector_base<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (pMVar1->starts).
        super__Vector_base<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_>::
      _M_realloc_insert<wabt::interp::StartDesc>(&pMVar1->starts,__position,(StartDesc *)&local_b8);
    }
    else {
      (__position._M_current)->func_index = func_index;
      (pMVar1->starts).
      super__Vector_base<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    EVar3 = Ok;
  }
  return (Result)EVar3;
}

Assistant:

Result BinaryReaderInterp::OnStartFunction(Index func_index) {
  CHECK_RESULT(
      validator_.OnStart(GetLocation(), Var(func_index, GetLocation())));
  module_.starts.push_back(StartDesc{func_index});
  return Result::Ok;
}